

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O2

StringRef __thiscall
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::consumeOneOption
          (format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *this,StringRef *Style,
          char Indicator,StringRef Default)

{
  ulong uVar1;
  char cVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  StringRef SVar9;
  ulong uVar8;
  
  pcVar6 = (char *)CONCAT71(in_register_00000011,Indicator);
  pcVar7 = Default.Data;
  if (*(long *)(this + 8) != 0) {
    cVar2 = StringRef::front((StringRef *)this);
    if (cVar2 == (char)Style) {
      SVar9 = StringRef::drop_front((StringRef *)this,1);
      *(StringRef *)this = SVar9;
      if (SVar9.Length == 0) {
        __assert_fail("false && \"Invalid range style\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                      ,0x170,
                      "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                     );
      }
      lVar4 = 0;
      do {
        if (lVar4 == 0x18) {
          __assert_fail("false && \"Invalid range style!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                        ,0x180,
                        "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                       );
        }
        pcVar7 = *(char **)((long)&DAT_011288b0 + lVar4);
        cVar2 = StringRef::front((StringRef *)this);
        lVar4 = lVar4 + 8;
      } while (cVar2 != *pcVar7);
      sVar3 = StringRef::find((StringRef *)this,pcVar7[1],0);
      if (sVar3 == 0xffffffffffffffff) {
        __assert_fail("false && \"Missing range option end delimeter!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                      ,0x179,
                      "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                     );
      }
      uVar1 = *(ulong *)(this + 8);
      uVar5 = (ulong)(uVar1 != 0);
      uVar8 = sVar3;
      if (sVar3 < uVar5) {
        uVar8 = uVar5;
      }
      if (uVar1 < sVar3) {
        uVar8 = uVar1;
      }
      pcVar7 = (char *)(uVar8 - uVar5);
      pcVar6 = (char *)(uVar5 + *(long *)this);
      SVar9 = StringRef::drop_front((StringRef *)this,sVar3 + 1);
      *(StringRef *)this = SVar9;
    }
  }
  SVar9.Length = (size_t)pcVar7;
  SVar9.Data = pcVar6;
  return SVar9;
}

Assistant:

static StringRef consumeOneOption(StringRef &Style, char Indicator,
                                    StringRef Default) {
    if (Style.empty())
      return Default;
    if (Style.front() != Indicator)
      return Default;
    Style = Style.drop_front();
    if (Style.empty()) {
      assert(false && "Invalid range style");
      return Default;
    }

    for (const char *D : {"[]", "<>", "()"}) {
      if (Style.front() != D[0])
        continue;
      size_t End = Style.find_first_of(D[1]);
      if (End == StringRef::npos) {
        assert(false && "Missing range option end delimeter!");
        return Default;
      }
      StringRef Result = Style.slice(1, End);
      Style = Style.drop_front(End + 1);
      return Result;
    }
    assert(false && "Invalid range style!");
    return Default;
  }